

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O0

void __thiscall TPZAnalysis::Print(TPZAnalysis *this,string *name,ostream *out)

{
  ostream *poVar1;
  TPZAdmChunkVector<TPZConnect,_10> *this_00;
  int64_t nelem;
  int64_t iVar2;
  void *this_01;
  TPZBaseMatrix *out_00;
  ostream *in_RDX;
  string *in_RSI;
  TPZAnalysis *in_RDI;
  TPZBaseMatrix *sol;
  TPZConnect *gnod;
  int64_t nelements;
  int64_t i;
  TPZCompMesh *in_stack_ffffffffffffffd0;
  TPZChunkVector<TPZConnect,_10> *this_02;
  
  poVar1 = (ostream *)std::ostream::operator<<(in_RDX,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,in_RSI);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if (in_RDI->fCompMesh == (TPZCompMesh *)0x0) {
    std::operator<<(in_RDX,"No computational mesh\n");
  }
  else {
    this_00 = TPZCompMesh::ConnectVec(in_RDI->fCompMesh);
    nelem = TPZChunkVector<TPZConnect,_10>::NElements
                      (&this_00->super_TPZChunkVector<TPZConnect,_10>);
    for (this_02 = (TPZChunkVector<TPZConnect,_10> *)0x0; (long)this_02 < nelem;
        this_02 = (TPZChunkVector<TPZConnect,_10> *)
                  ((long)&(this_02->super_TPZSavable)._vptr_TPZSavable + 1)) {
      TPZCompMesh::ConnectVec(in_RDI->fCompMesh);
      in_stack_ffffffffffffffd0 =
           (TPZCompMesh *)TPZChunkVector<TPZConnect,_10>::operator[](this_02,nelem);
      iVar2 = TPZConnect::SequenceNumber((TPZConnect *)in_stack_ffffffffffffffd0);
      if (iVar2 != -1) {
        poVar1 = std::operator<<(in_RDX,"Connect index ");
        this_01 = (void *)std::ostream::operator<<(poVar1,(long)this_02);
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
        TPZConnect::Print((TPZConnect *)out,(TPZCompMesh *)i,(ostream *)nelements);
      }
    }
  }
  Solution(in_RDI);
  out_00 = TPZSolutionMatrix::operator_cast_to_TPZBaseMatrix_((TPZSolutionMatrix *)in_RDI);
  (*(out_00->super_TPZSavable)._vptr_TPZSavable[0x1c])(out_00,"fSolution",in_RDX,0);
  if (in_RDI->fCompMesh != (TPZCompMesh *)0x0) {
    TPZCompMesh::ConnectSolution(in_stack_ffffffffffffffd0,(ostream *)out_00);
  }
  return;
}

Assistant:

void TPZAnalysis::Print( const std::string &name, std::ostream &out) {
	out<<endl<<name<<endl;
    if (!fCompMesh) {
        out << "No computational mesh\n";
    }
    else
    {
        int64_t i,nelements = fCompMesh->ConnectVec().NElements();
        for(i=0;i<nelements;i++) {
            TPZConnect &gnod = fCompMesh->ConnectVec()[i];
            if(gnod.SequenceNumber()!=-1) {
                out << "Connect index " << i << endl;
                gnod.Print(*fCompMesh,out);
            }
        }
    }
    TPZBaseMatrix &sol = this->Solution();
	sol.Print("fSolution",out);
    if (fCompMesh) {
        fCompMesh->ConnectSolution(out);
    }
}